

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O2

void Js::OpCodeUtil::ConvertOpToNonProfiled(OpCode *op)

{
  OpCode OVar1;
  OpCode OVar2;
  
  OVar1 = *op;
  OVar2 = OVar1 & ~ExtendedMediumLayoutPrefix;
  if (OVar2 != ProfiledCallI) {
    if (OVar2 == ProfiledReturnTypeCallI) {
      OVar1 = ConvertProfiledReturnTypeCallOpToNonProfiled(OVar1);
      goto LAB_007db703;
    }
    if (OVar2 != ProfiledCallIWithICIndex) {
      ConvertNonCallOpToNonProfiled(op);
      return;
    }
  }
  OVar1 = ConvertProfiledCallOpToNonProfiled(OVar1);
LAB_007db703:
  *op = OVar1;
  return;
}

Assistant:

void OpCodeUtil::ConvertOpToNonProfiled(OpCode& op)
    {
        if (IsProfiledCallOp(op) || IsProfiledCallOpWithICIndex(op))
        {
            op = ConvertProfiledCallOpToNonProfiled(op);
        }
        else if (IsProfiledReturnTypeCallOp(op))
        {
            op = ConvertProfiledReturnTypeCallOpToNonProfiled(op);
        }
        else
        {
            ConvertNonCallOpToNonProfiled(op);
        }
    }